

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task.cpp
# Opt level: O1

void __thiscall Task::Task(Task *this,proxy *proxy_info,curl_off_t start,curl_off_t end)

{
  curl_off_t cVar1;
  undefined4 uVar2;
  
  (this->proxy_server).address._M_dataplus._M_p = (pointer)&(this->proxy_server).address.field_2;
  (this->proxy_server).address._M_string_length = 0;
  (this->proxy_server).address.field_2._M_local_buf[0] = '\0';
  (this->proxy_server).speed = -1;
  (this->taskThread)._M_id._M_thread = 0;
  this->task_id = global_task_id;
  global_task_id = global_task_id + 1;
  std::__cxx11::string::_M_assign((string *)&this->proxy_server);
  uVar2 = *(undefined4 *)&proxy_info->field_0x24;
  cVar1 = proxy_info->speed;
  (this->proxy_server).index = proxy_info->index;
  *(undefined4 *)&(this->proxy_server).field_0x24 = uVar2;
  (this->proxy_server).speed = cVar1;
  this->start = start;
  this->end = end;
  this->download = 0;
  this->status = 0;
  this->speed = 0;
  return;
}

Assistant:

Task::Task(proxy proxy_info, curl_off_t start, curl_off_t end) {
    this->task_id = global_task_id;
    global_task_id++;
    this->proxy_server = proxy_info;
    this->start = start;
    this->end = end;
    download = 0;
    status = STATUS_CREATE;
    speed = 0;
}